

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

pqpair tnonc_s2pq(double t,double df,double delta)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double __x;
  undefined1 auVar31 [16];
  pqpair pVar32;
  double q;
  double p;
  double xx;
  undefined1 local_148 [16];
  double local_138;
  double dStack_130;
  undefined1 local_128 [48];
  undefined1 local_f8 [216];
  double local_20;
  double local_18;
  double local_10;
  
  dVar28 = 0.0;
  if (df <= 0.0) {
    dVar29 = 1.0;
  }
  else if (1e-08 <= ABS(delta)) {
    dVar28 = (double)(-(ulong)(0.0 <= t) & (ulong)delta | ~-(ulong)(0.0 <= t) & (ulong)-delta);
    local_10 = -dVar28;
    cumnor(&local_10,&local_18,&local_20);
    if ((t != 0.0) || (NAN(t))) {
      uVar22 = (undefined4)((ulong)-t >> 0x20);
      if (-t <= t) {
        uVar22 = (undefined4)((ulong)t >> 0x20);
      }
      dVar23 = (double)(~-(ulong)(df == 1.0) & (ulong)df | -(ulong)(df == 1.0) & 0x3ff000001ad7f29b)
      ;
      dVar29 = (double)CONCAT44(uVar22,SUB84(t,0)) * (double)CONCAT44(uVar22,SUB84(t,0));
      __x = dVar28 * 0.5 * dVar28;
      dVar29 = dVar29 / (dVar29 + dVar23);
      dVar10 = (double)(int)__x;
      local_128._0_8_ = dVar10 + 1.0;
      local_128._8_8_ = dVar10 + 0.5;
      dVar23 = dVar23 * 0.5;
      dVar11 = log(__x);
      dVar12 = alng((double)local_128._0_8_);
      local_f8._0_8_ = exp((dVar11 * dVar10 - __x) - dVar12);
      dVar11 = log(__x);
      dVar12 = alng((double)local_128._0_8_ + 0.5);
      local_f8._8_8_ = exp((dVar11 * dVar10 - __x) - dVar12);
      dVar11 = betadf(dVar29,(double)local_128._8_8_,dVar23);
      dVar12 = betadf(dVar29,(double)local_128._0_8_,dVar23);
      dVar10 = dVar23 + (double)local_128._8_8_;
      dVar24 = dVar10 + -1.0;
      dVar13 = 1.0 - dVar29;
      if (dVar24 <= 0.0) {
        dVar14 = alng(dVar10);
        dVar15 = alng((double)local_128._8_8_);
        dVar16 = alng(dVar23);
        dVar17 = log(dVar29);
        dVar18 = log(dVar13);
        dVar14 = exp(dVar18 * dVar23 +
                     dVar17 * ((double)local_128._8_8_ + -1.0) + ((dVar14 - dVar15) - dVar16));
        dVar14 = dVar14 / dVar24;
      }
      else {
        dVar14 = alng(dVar24);
        dVar15 = alng((double)local_128._8_8_);
        dVar16 = alng(dVar23);
        dVar17 = log(dVar29);
        dVar18 = log(dVar13);
        dVar14 = exp(dVar18 * dVar23 +
                     dVar17 * ((double)local_128._8_8_ + -1.0) + ((dVar14 - dVar15) - dVar16));
      }
      iVar9 = (int)__x;
      dVar15 = dVar23 + (double)local_128._0_8_;
      dVar16 = alng(dVar15 + -1.0);
      dVar17 = alng((double)local_128._0_8_);
      dVar18 = alng(dVar23);
      dVar19 = log(dVar29);
      dVar13 = log(dVar13);
      auVar21._0_8_ =
           exp(dVar13 * dVar23 +
               dVar19 * ((double)local_128._0_8_ + -1.0) + ((dVar16 - dVar17) - dVar18));
      auVar21._8_8_ = dVar14;
      auVar25._0_8_ = (dVar15 + -1.0) * dVar29 * auVar21._0_8_;
      auVar25._8_8_ = dVar24 * dVar29 * dVar14;
      local_148 = divpd(auVar25,local_128._0_16_);
      dVar28 = dVar28 / 1.4142135623731;
      dVar23 = 1.0 - (double)local_f8._0_8_;
      dVar13 = dVar11 * (double)local_f8._0_8_ + (double)local_f8._8_8_ * dVar28 * dVar12;
      auVar27._8_8_ = local_f8._0_8_;
      auVar27._0_8_ = local_f8._8_8_;
      iVar5 = 0;
      dStack_130 = dVar11;
      local_138 = dVar12;
      iVar8 = 0;
      do {
        while( true ) {
          iVar7 = iVar5 + 1;
          dVar14 = (double)iVar7;
          auVar20._0_8_ = auVar21._0_8_ * dVar29 * (dVar15 + dVar14 + -2.0);
          auVar20._8_8_ = auVar21._8_8_ * dVar29 * (dVar10 + dVar14 + -2.0);
          auVar3._8_8_ = (double)local_128._8_8_ + dVar14 + -1.0;
          auVar3._0_8_ = (double)local_128._0_8_ + dVar14 + -1.0;
          auVar21 = divpd(auVar20,auVar3);
          auVar26._0_8_ = auVar27._0_8_ * __x;
          auVar26._8_8_ = auVar27._8_8_ * __x;
          auVar4._8_8_ = (double)(iVar9 + iVar7);
          auVar4._0_8_ = (double)(iVar9 + iVar7) + -1.0 + 1.5;
          auVar27 = divpd(auVar26,auVar4);
          dVar12 = dVar12 - auVar21._0_8_;
          dVar11 = dVar11 - auVar21._8_8_;
          dVar24 = dVar23 - auVar27._8_8_;
          dVar13 = auVar27._0_8_ * dVar12 * dVar28 + auVar27._8_8_ * dVar11 + dVar13;
          if (iVar9 <= iVar8) break;
          auVar30._0_8_ = (double)local_148._0_8_ * (((double)local_128._0_8_ - dVar14) + 1.0);
          auVar30._8_8_ = (double)local_148._8_8_ * (((double)local_128._8_8_ - dVar14) + 1.0);
          auVar2._8_8_ = (dVar10 - dVar14) * dVar29;
          auVar2._0_8_ = (dVar15 - dVar14) * dVar29;
          local_148 = divpd(auVar30,auVar2);
          local_138 = local_138 + local_148._0_8_;
          dStack_130 = dStack_130 + local_148._8_8_;
          dVar23 = (double)(iVar9 - iVar7) + 1.0;
          auVar31._0_8_ = (double)local_f8._0_8_ * dVar23;
          auVar31._8_8_ = (double)local_f8._8_8_ * (dVar23 + 0.5);
          auVar6._8_8_ = __x;
          auVar6._0_8_ = __x;
          local_f8._0_16_ = divpd(auVar31,auVar6);
          dVar13 = local_f8._8_8_ * local_138 * dVar28 + dStack_130 * local_f8._0_8_ + dVar13;
          dVar23 = dVar24 - local_f8._0_8_;
          if ((dVar23 <= 1e-12) || (bVar1 = 0x270d < iVar5, iVar5 = iVar7, iVar8 = iVar7, bVar1))
          goto LAB_00110de7;
        }
      } while ((1e-12 < dVar23 * (ABS(delta) * 0.5 + 1.0) * 0.5 * dVar11) &&
              (bVar1 = iVar5 < 0x270e, dVar23 = dVar24, iVar5 = iVar7, bVar1));
LAB_00110de7:
      local_18 = dVar13 * 0.5 + local_18;
      dVar29 = 1.0 - local_18;
      if (t < 0.0) {
        dVar29 = local_18;
      }
      dVar28 = (double)(~-(ulong)(0.0 <= t) & (ulong)(1.0 - local_18) |
                       (ulong)local_18 & -(ulong)(0.0 <= t));
    }
    else {
      dVar29 = 1.0 - local_18;
      dVar28 = local_18;
    }
  }
  else {
    pVar32 = student_s2pq(t,df);
    dVar29 = pVar32.q;
    dVar28 = pVar32.p;
  }
  pVar32.q = dVar29;
  pVar32.p = dVar28;
  return pVar32;
}

Assistant:

static pqpair tnonc_s2pq( double t , double df , double delta )
{
   int indx , k , i ;
   double x,del,tnd,ans,y,dels,a,b,c ;
   double pkf,pkb,qkf,qkb , pgamf,pgamb,qgamf,qgamb ;
   double pbetaf,pbetab,qbetaf,qbetab ;
   double ptermf,qtermf,ptermb,qtermb,term ;
   double rempois,delosq2,sum,cons,error ;

   pqpair pq={0.0,1.0} ;  /* will be return value */
   double ab1 ;

   /*-- stupid user? --*/

   if( df <= 0.0 ) return pq ;

   /*-- non-centrality = 0? --*/

   if( fabs(delta) < 1.e-8 ) return student_s2pq(t,df) ;

   /*-- start K's code here --*/

   if( t < 0.0 ){ x = -t ; del = -delta ; indx = 1 ; }  /* x will be */
   else         { x =  t ; del =  delta ; indx = 0 ; }  /* positive */

   ans = gaudf(-del) ;  /* prob that x <= 0 = Normal cdf */

   /*-- the nearly trivial case of x=0 --*/

   if( x == 0.0 ){ pq.p = ans; pq.q = 1.0-ans; return pq; }

   if( df == 1.0 ) df = 1.0000001 ;  /** df=1 is BAD **/

   y = x*x/(df+x*x) ;    /* between 0 and 1 */
   dels = 0.5*del*del ;  /* will be positive */
   k = (int)dels ;       /* 0, 1, 2, ... */
   a = k+0.5 ;           /* might be as small as 0.5 */
   c = k+1.0 ;
   b = 0.5*df ;          /* might be as small as 0.0 */

   pkf = exp(-dels+k*log(dels)-alng(k+1.0)) ;
   pkb = pkf ;
   qkf = exp(-dels+k*log(dels)-alng(k+1.0+0.5)) ;
   qkb = qkf ;

   pbetaf = betadf(y, a, b) ;
   pbetab = pbetaf ;
   qbetaf = betadf(y, c, b) ;
   qbetab = qbetaf ;

   ab1 = a+b-1.0 ;  /* might be as small as -0.5 */

   /*-- RWCox: if a+b-1 < 0, log(Gamma(a+b-1)) won't work;
               instead, use Gamma(a+b-1)=Gamma(a+b)/(a+b-1) --*/

   if( ab1 > 0.0 )
     pgamf = exp(alng(ab1)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y)) ;
   else
     pgamf = exp(alng(a+b)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y))/ab1 ;

   pgamb = pgamf*y*(ab1)/a ;

   /*-- we can't have c+b-1 < 0, so the above patchup isn't needed --*/

   qgamf = exp(alng(c+b-1.0)-alng(c)-alng(b)+(c-1.0)*log(y) + b*log(1.0-y)) ;
   qgamb = qgamf*y*(c+b-1.0)/c ;

   rempois = 1.0 - pkf ;
   delosq2 = del/1.4142135623731 ;
   sum = pkf*pbetaf+delosq2*qkf*qbetaf ;
   cons = 0.5*(1.0 + 0.5*fabs(delta)) ;
   i = 0 ;
L1:
   i = i + 1 ;
   pgamf = pgamf*y*(a+b+i-2.0)/(a+i-1.0) ;
   pbetaf = pbetaf - pgamf ;
   pkf = pkf*dels/(k+i) ;
   ptermf = pkf*pbetaf ;
   qgamf = qgamf*y*(c+b+i-2.0)/(c+i-1.0) ;
   qbetaf = qbetaf - qgamf ;
   qkf = qkf*dels/(k+i-1.0+1.5) ;
   qtermf = qkf*qbetaf ;
   term = ptermf + delosq2*qtermf  ;
   sum = sum + term ;
   error = rempois*cons*pbetaf ;
   rempois = rempois - pkf ;

   if( i > k ){
     if( error <= 1.e-12 || i >= 9999 ) goto L2 ;
     goto L1 ;
   } else {
     pgamb = pgamb*(a-i+1.0)/(y*(a+b-i)) ;
     pbetab = pbetab + pgamb ;
     pkb = (k-i+1.0)*pkb/dels ;
     ptermb = pkb*pbetab  ;
     qgamb = qgamb*(c-i+1.0)/(y*(c+b-i)) ;
     qbetab = qbetab + qgamb ;
     qkb = (k-i+1.0+0.5)*qkb/dels ;
     qtermb = qkb*qbetab  ;
     term =  ptermb + delosq2*qtermb ;
     sum = sum + term  ;
     rempois = rempois - pkb ;
     if (rempois <= 1.e-12 || i >= 9999) goto L2 ;
     goto L1 ;
   }
L2:
   tnd = 0.5*sum + ans ;

   /*-- return a pqpair, not just the cdf --*/

   if( indx ){ pq.p = 1.0-tnd; pq.q = tnd    ; }
   else      { pq.p = tnd    ; pq.q = 1.0-tnd; }
   return pq ;
}